

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdGetConfidentialTxInPeginWitnessCount
              (void *handle,char *tx_hex_string,uint32_t txin_index,uint32_t *count)

{
  bool bVar1;
  uint32_t uVar2;
  CfdException *this;
  allocator local_241;
  ConfidentialTxInReference ref;
  ConfidentialTransactionContext tx;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&ref,tx_hex_string,&local_241);
    cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&tx,(string *)&ref);
    std::__cxx11::string::~string((string *)&ref);
    cfd::core::ConfidentialTransaction::GetTxIn(&ref,&tx.super_ConfidentialTransaction,txin_index);
    if (count != (uint32_t *)0x0) {
      uVar2 = cfd::core::ScriptWitness::GetWitnessNum(&ref.pegin_witness_);
      *count = uVar2;
    }
    cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&ref);
    cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&tx);
    return 0;
  }
  ref.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)0x4fbb12;
  ref.super_AbstractTxInReference.txid_._vptr_Txid._0_4_ = 0x32e;
  ref.super_AbstractTxInReference.txid_.data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = "CfdGetConfidentialTxInPeginWitnessCount";
  cfd::core::logger::warn<>((CfdSourceLocation *)&ref,"tx is null or empty.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&ref,"Failed to parameter. tx is null or empty.",(allocator *)&tx);
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&ref);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetConfidentialTxInPeginWitnessCount(
    void* handle, const char* tx_hex_string, uint32_t txin_index,
    uint32_t* count) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    ConfidentialTransactionContext tx(tx_hex_string);
    const ConfidentialTxInReference ref = tx.GetTxIn(txin_index);
    if (count != nullptr) {
      *count = ref.GetPeginWitnessStackNum();
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}